

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O0

Aig_Obj_t * Aig_IthVar(Aig_Man_t *p,int i)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_18;
  int v;
  int i_local;
  Aig_Man_t *p_local;
  
  for (local_18 = Aig_ManCiNum(p); local_18 <= i; local_18 = local_18 + 1) {
    Aig_ObjCreateCi(p);
  }
  iVar1 = Vec_PtrSize(p->vCis);
  if (i < iVar1) {
    pAVar2 = Aig_ManCi(p,i);
    return pAVar2;
  }
  __assert_fail("i < Vec_PtrSize(p->vCis)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOper.c"
                ,0x44,"Aig_Obj_t *Aig_IthVar(Aig_Man_t *, int)");
}

Assistant:

Aig_Obj_t * Aig_IthVar( Aig_Man_t * p, int i )
{
    int v;
    for ( v = Aig_ManCiNum(p); v <= i; v++ )
        Aig_ObjCreateCi( p );
    assert( i < Vec_PtrSize(p->vCis) );
    return Aig_ManCi( p, i );
}